

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::CheckResume(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  int index;
  ostream *poVar2;
  istream *piVar3;
  string fname;
  string line;
  ifstream fin;
  
  cmCTest::GetBinaryDir_abi_cxx11_((string *)&fin,this->CTest);
  std::operator+(&fname,(string *)&fin,"/Testing/Temporary/CTestCheckpoint.txt");
  std::__cxx11::string::~string((string *)&fin);
  if (this->CTest->Failover == true) {
    bVar1 = cmsys::SystemTools::FileExists(fname._M_dataplus._M_p,true);
    if (bVar1) {
      poVar2 = std::operator<<(this->TestHandler->LogFile,"Resuming previously interrupted test set"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"----------------------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ifstream::ifstream(&fin);
      std::ifstream::open((char *)&fin,(_Ios_Openmode)fname._M_dataplus._M_p);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&fin,(string *)&line);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        index = atoi(line._M_dataplus._M_p);
        RemoveTest(this,index);
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&fin);
    }
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(fname._M_dataplus._M_p,true);
    if (bVar1) {
      cmsys::SystemTools::RemoveFile(&fname);
    }
  }
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CheckResume()
{
  std::string fname =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/CTestCheckpoint.txt";
  if (this->CTest->GetFailover()) {
    if (cmSystemTools::FileExists(fname.c_str(), true)) {
      *this->TestHandler->LogFile
        << "Resuming previously interrupted test set" << std::endl
        << "----------------------------------------------------------"
        << std::endl;

      cmsys::ifstream fin;
      fin.open(fname.c_str());
      std::string line;
      while (std::getline(fin, line)) {
        int index = atoi(line.c_str());
        this->RemoveTest(index);
      }
      fin.close();
    }
  } else if (cmSystemTools::FileExists(fname.c_str(), true)) {
    cmSystemTools::RemoveFile(fname);
  }
}